

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteSubtype(Unsubtyping *this,Type sub,Type super)

{
  Type sub_00;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  Type *pTVar5;
  HeapType sub_01;
  HeapType super_00;
  size_t size;
  size_t i;
  Unsubtyping *this_local;
  Type super_local;
  Type sub_local;
  
  this_local = (Unsubtyping *)super.id;
  super_local = sub;
  bVar1 = wasm::Type::isTuple(&super_local);
  if (bVar1) {
    bVar2 = wasm::Type::isTuple((Type *)&this_local);
    bVar1 = false;
    if (bVar2) {
      sVar4 = wasm::Type::size(&super_local);
      sVar3 = wasm::Type::size((Type *)&this_local);
      bVar1 = sVar4 == sVar3;
    }
    if (!bVar1) {
      __assert_fail("super.isTuple() && sub.size() == super.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                    ,0xad,"void wasm::(anonymous namespace)::Unsubtyping::noteSubtype(Type, Type)");
    }
    size = 0;
    sVar4 = wasm::Type::size(&super_local);
    for (; size < sVar4; size = size + 1) {
      pTVar5 = wasm::Type::operator[](&super_local,size);
      sub_00.id = pTVar5->id;
      pTVar5 = wasm::Type::operator[]((Type *)&this_local,size);
      noteSubtype(this,sub_00,(Type)pTVar5->id);
    }
  }
  else {
    bVar1 = wasm::Type::isRef(&super_local);
    if ((bVar1) && (bVar1 = wasm::Type::isRef((Type *)&this_local), bVar1)) {
      sub_01 = wasm::Type::getHeapType(&super_local);
      super_00 = wasm::Type::getHeapType((Type *)&this_local);
      noteSubtype(this,sub_01,super_00);
    }
  }
  return;
}

Assistant:

void noteSubtype(Type sub, Type super) {
    if (sub.isTuple()) {
      assert(super.isTuple() && sub.size() == super.size());
      for (size_t i = 0, size = sub.size(); i < size; ++i) {
        noteSubtype(sub[i], super[i]);
      }
      return;
    }
    if (!sub.isRef() || !super.isRef()) {
      return;
    }
    noteSubtype(sub.getHeapType(), super.getHeapType());
  }